

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

double task3(Matrix *A)

{
  long lVar1;
  long lVar2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> ans;
  Matrix local_40;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_30;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  Matrix::Matrix(&local_40,A);
  EigQR((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_30,&local_40,
        &it);
  Matrix::~Matrix(&local_40);
  lVar2 = std::chrono::_V2::system_clock::now();
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&local_30);
  return (double)((lVar2 - lVar1) / 1000000);
}

Assistant:

double task3(Matrix A)
{
    std::chrono::time_point<std::chrono::high_resolution_clock> start, end;

    start = std::chrono::high_resolution_clock::now();
    auto ans = EigQR(std::move(A));
    end = std::chrono::high_resolution_clock::now();

    return std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count();
}